

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::err_handler_(logger *this,string *msg)

{
  bool bVar1;
  type __lhs;
  char *pcVar2;
  char *pcVar3;
  logger *in_RDI;
  char date_buf [64];
  tm tm_time;
  time_point now;
  lock_guard<std::mutex> lk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffef0;
  FILE *__stream;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef8;
  size_t sVar4;
  time_point *in_stack_ffffffffffffff00;
  char *pcVar5;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char local_d8 [64];
  time_t local_98;
  tm local_90;
  uint local_54;
  __unspec local_4d;
  int local_4c;
  duration<long,std::ratio<1l,1l>> local_48 [24];
  rep local_30;
  type local_21;
  duration local_20;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x6b63fd);
  if (bVar1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
               (mutex_type *)in_stack_fffffffffffffee8);
    local_20.__r = std::chrono::_V2::system_clock::now();
    err_handler_::err_counter = err_handler_::err_counter + 1;
    __lhs = std::chrono::operator-
                      (in_stack_fffffffffffffef8,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffef0);
    local_4c = 1;
    local_30 = __lhs.__r;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_48,&local_4c);
    local_21 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1L>_>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)__lhs.__r,
                                (duration<long,_std::ratio<1L,_1L>_> *)
                                CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::__cmp_cat::__unspec::__unspec(&local_4d,(__unspec *)0x0);
    bVar1 = std::operator<(local_21);
    if (!bVar1) {
      err_handler_::last_report_time.__d.__r = (duration)(duration)local_20.__r;
      local_98 = std::chrono::_V2::system_clock::to_time_t(in_stack_ffffffffffffff00);
      details::os::localtime((os *)&local_90,&local_98);
      strftime(local_d8,0x40,"%Y-%m-%d %H:%M:%S",&local_90);
      pcVar5 = local_d8;
      __stream = _stderr;
      sVar4 = err_handler_::err_counter;
      name_abi_cxx11_(in_RDI);
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__stream);
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__stream);
      fprintf(__stream,"[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n",sVar4,pcVar5,pcVar2,pcVar3);
    }
    local_54 = (uint)bVar1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6b65f7);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::err_handler_(const std::string &msg) {
    if (custom_err_handler_) {
        custom_err_handler_(msg);
    } else {
        using std::chrono::system_clock;
        static std::mutex mutex;
        static std::chrono::system_clock::time_point last_report_time;
        static size_t err_counter = 0;
        std::lock_guard<std::mutex> lk{mutex};
        auto now = system_clock::now();
        err_counter++;
        if (now - last_report_time < std::chrono::seconds(1)) {
            return;
        }
        last_report_time = now;
        auto tm_time = details::os::localtime(system_clock::to_time_t(now));
        char date_buf[64];
        std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
#if defined(USING_R) && defined(R_R_H)  // if in R environment
        REprintf("[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n", err_counter, date_buf, name().c_str(),
                 msg.c_str());
#else
        std::fprintf(stderr, "[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n", err_counter, date_buf,
                     name().c_str(), msg.c_str());
#endif
    }
}